

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_integrate2(ref_metric_integrand2 integrand,void *state,REF_DBL *integral)

{
  uint uVar1;
  double in_RAX;
  REF_DBL (*paRVar2) [3];
  long lVar3;
  REF_DBL value;
  double local_38;
  
  *integral = 0.0;
  paRVar2 = baryq2;
  lVar3 = 0;
  local_38 = in_RAX;
  do {
    uVar1 = (*integrand)(state,*paRVar2,&local_38);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xe74,"ref_metric_integrate2",(ulong)uVar1,"eval");
      return uVar1;
    }
    *integral = *(double *)((long)weightq2 + lVar3) * local_38 + *integral;
    lVar3 = lVar3 + 8;
    paRVar2 = paRVar2 + 1;
  } while (lVar3 != 200);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrate2(ref_metric_integrand2 integrand,
                                         void *state, REF_DBL *integral) {
  REF_INT i;
  REF_DBL value;
  *integral = 0.0;
  for (i = 0; i < nq2; i++) {
    RSS(integrand(state, baryq2[i], &value), "eval");
    *integral += weightq2[i] * value;
  }

  return REF_SUCCESS;
}